

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ReservedExtensionRangeError_Test::
~ValidationErrorTest_ReservedExtensionRangeError_Test
          (ValidationErrorTest_ReservedExtensionRangeError_Test *this)

{
  ValidationErrorTest_ReservedExtensionRangeError_Test *this_local;
  
  ~ValidationErrorTest_ReservedExtensionRangeError_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ReservedExtensionRangeError) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  extension_range { start: 10 end: 20 }"
      "  reserved_range { start: 5 end: 15 }"
      "}",

      "foo.proto: Foo: NUMBER: Extension range 10 to 19"
      " overlaps with reserved range 5 to 14.\n");
}